

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

int lodepng_color_mode_equal(LodePNGColorMode *a,LodePNGColorMode *b)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  iVar1 = 0;
  if (((((a->colortype == b->colortype) && (a->bitdepth == b->bitdepth)) &&
       (a->key_defined == b->key_defined)) &&
      ((a->key_defined == 0 ||
       (((a->key_r == b->key_r && (a->key_g == b->key_g)) && (a->key_b == b->key_b)))))) &&
     (a->palettesize == b->palettesize)) {
    lVar2 = a->palettesize << 2;
    iVar1 = 1;
    if (lVar2 != 0) {
      lVar3 = 0;
      do {
        if (a->palette[lVar3] != b->palette[lVar3]) {
          return 0;
        }
        lVar3 = lVar3 + 1;
      } while (lVar2 != lVar3);
    }
  }
  return iVar1;
}

Assistant:

static int lodepng_color_mode_equal(const LodePNGColorMode* a, const LodePNGColorMode* b)
{
	size_t i;
	if (a->colortype != b->colortype) return 0;
	if (a->bitdepth != b->bitdepth) return 0;
	if (a->key_defined != b->key_defined) return 0;
	if (a->key_defined)
	{
		if (a->key_r != b->key_r) return 0;
		if (a->key_g != b->key_g) return 0;
		if (a->key_b != b->key_b) return 0;
	}
	/*if one of the palette sizes is 0, then we consider it to be the same as the
	other: it means that e.g. the palette was not given by the user and should be
	considered the same as the palette inside the PNG.*/
	if (1/*a->palettesize != 0 && b->palettesize != 0*/) {
		if (a->palettesize != b->palettesize) return 0;
		for (i = 0; i != a->palettesize * 4; ++i)
		{
			if (a->palette[i] != b->palette[i]) return 0;
		}
	}
	return 1;
}